

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O0

void __thiscall duckdb::ParsedExpression::Serialize(ParsedExpression *this,Serializer *serializer)

{
  Serializer *in_RSI;
  optional_idx *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd8;
  field_id_t field_id;
  Serializer *in_stack_ffffffffffffffe0;
  optional_idx *tag;
  field_id_t in_stack_ffffffffffffffee;
  Serializer *this_00;
  
  field_id = (field_id_t)((ulong)in_stack_ffffffffffffffd8 >> 0x30);
  Serializer::WriteProperty<duckdb::ExpressionClass>
            (in_stack_ffffffffffffffe0,field_id,(char *)in_RDI,
             (ExpressionClass *)in_stack_ffffffffffffffc8);
  Serializer::WriteProperty<duckdb::ExpressionType>
            (in_stack_ffffffffffffffe0,field_id,(char *)in_RDI,
             (ExpressionType *)in_stack_ffffffffffffffc8);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (in_stack_ffffffffffffffe0,field_id,(char *)in_RDI,in_stack_ffffffffffffffc8);
  tag = in_RDI + 6;
  this_00 = in_RSI;
  optional_idx::optional_idx((optional_idx *)&stack0xffffffffffffffe8);
  Serializer::WritePropertyWithDefault<duckdb::optional_idx>
            (this_00,in_stack_ffffffffffffffee,(char *)tag,(optional_idx *)in_RSI,in_RDI);
  return;
}

Assistant:

void ParsedExpression::Serialize(Serializer &serializer) const {
	serializer.WriteProperty<ExpressionClass>(100, "class", expression_class);
	serializer.WriteProperty<ExpressionType>(101, "type", type);
	serializer.WritePropertyWithDefault<string>(102, "alias", alias);
	serializer.WritePropertyWithDefault<optional_idx>(103, "query_location", query_location, optional_idx());
}